

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o1.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::SegmentO1::JacobianInverseGramian
          (MatrixXd *__return_storage_ptr__,SegmentO1 *this,MatrixXd *local)

{
  Matrix<double,__1,_2,_0,__1,_2> *pMVar1;
  Index IVar2;
  undefined1 auVar3 [16];
  Scalar SVar4;
  MatrixXd *pMVar5;
  int iVar6;
  undefined8 *puVar7;
  long lVar8;
  ActualDstType actualDst;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *pCVar9;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
  *pCVar10;
  LhsNested *pLVar11;
  byte bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  scalar_quotient_op<double,_double> local_361;
  MatrixXd *local_360;
  scalar_constant_op<double> local_358;
  undefined1 local_350 [144];
  scalar_constant_op<double> local_2c0;
  variable_if_dynamic<long,__1> local_2b0;
  variable_if_dynamic<long,__1> local_2a8;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0> local_2a0;
  Matrix<double,__1,_2,_0,__1,_2> *local_288;
  undefined8 local_280;
  undefined8 local_278;
  Index local_270;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
  local_268;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1f0;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0> local_150;
  Matrix<double,__1,_2,_0,__1,_2> *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  Index local_120;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0> local_118;
  Matrix<double,__1,_2,_0,__1,_2> *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  Index local_e8;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0> local_e0;
  Matrix<double,__1,_2,_0,__1,_2> *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  Index local_b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
  local_a8;
  
  bVar12 = 0;
  iVar6 = (*(this->super_Geometry)._vptr_Geometry[1])(this);
  pMVar1 = &this->coords_;
  if (iVar6 == 1) {
    IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
            .m_rows;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_0>::
    MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0> *)
            &local_268,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
            .m_data + IVar2,IVar2,1);
    local_268.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>.
    m_startRow.m_value = 0;
    local_268.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>.
    m_startCol.m_value = 1;
    local_268.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>.
    m_outerStride =
         (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.
         m_rows;
    local_268.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>.m_xpr =
         pMVar1;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_0>::
    MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0> *)
            &local_a8,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
            .m_data,local_268.m_lhs.
                    super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>
                    .m_outerStride,1);
    local_a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>.
    m_startRow.m_value = 0;
    local_a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>.
    m_startCol.m_value = 0;
    local_a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>.
    m_outerStride =
         (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.
         m_rows;
    local_a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>.m_xpr =
         pMVar1;
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
                     *)&local_1f0,&local_268.m_lhs,&local_a8.m_lhs,
                    (scalar_difference_op<double,_double> *)local_350);
    local_2c0.m_other =
         (double)(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                 .m_cols;
    pCVar9 = &local_1f0;
    puVar7 = (undefined8 *)(local_350 + 8);
    for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar7 = (((LhsNested *)&pCVar9->field_0x0)->
                super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>
                ).
                super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0>
                .m_data;
      pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)((long)pCVar9 + (ulong)bVar12 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
    }
    local_350._136_8_ = 1;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    if ((local_2c0.m_other != 0.0 && local_350._72_8_ != 0) &&
       (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar3 / SEXT816((long)local_2c0.m_other),0) < (long)local_350._72_8_)) {
      puVar7 = (undefined8 *)
               __cxa_allocate_exception
                         (8,local_350._72_8_,SUB168(auVar3 % SEXT816((long)local_2c0.m_other),0));
      *puVar7 = &std::out_of_range::vtable;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,local_350._72_8_,
               (Index)local_2c0.m_other);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Replicate<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const>const>,_1,_1>,Eigen::internal::assign_op<double,double>>
              (__return_storage_ptr__,
               (Replicate<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>_>,__1,__1>
                *)local_350,(assign_op<double,_double> *)&local_2a0);
  }
  else {
    IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
            .m_rows;
    local_360 = local;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_0>::
    MapBase(&local_2a0,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
            .m_data + IVar2,IVar2,1);
    local_280 = 0;
    local_278 = 1;
    local_270 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
                m_storage.m_rows;
    local_288 = pMVar1;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_0>::
    MapBase(&local_e0,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
            .m_data,local_270,1);
    local_c0 = 0;
    uStack_b8 = 0;
    local_b0 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
               m_storage.m_rows;
    local_c8 = pMVar1;
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>
    ::CwiseBinaryOp(&local_268,(Lhs *)&local_2a0,(Rhs *)&local_e0,
                    (scalar_difference_op<double,_double> *)local_350);
    IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
            .m_rows;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_0>::
    MapBase(&local_118,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
            .m_data + IVar2,IVar2,1);
    local_f8 = 0;
    local_f0 = 1;
    local_e8 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
               m_storage.m_rows;
    local_100 = pMVar1;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_0>::
    MapBase(&local_150,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage
            .m_data,local_e8,1);
    local_130 = 0;
    uStack_128 = 0;
    local_120 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
                m_storage.m_rows;
    local_138 = pMVar1;
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>
    ::CwiseBinaryOp(&local_a8,(Lhs *)&local_118,(Rhs *)&local_150,
                    (scalar_difference_op<double,_double> *)local_350);
    pCVar10 = &local_a8;
    puVar7 = (undefined8 *)(local_350 + 8);
    for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar7 = (pCVar10->m_lhs).
                super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0>
                .m_data;
      pCVar10 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
                 *)((long)pCVar10 + (ulong)bVar12 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
    }
    if (local_350._72_8_ == 0) {
      uVar13 = 0;
      uVar14 = 0;
    }
    else {
      SVar4 = Eigen::
              DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>const>const>>
              ::redux<Eigen::internal::scalar_sum_op<double,double>>
                        ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const>const>>
                          *)local_350,(scalar_sum_op<double,_double> *)&local_1f0);
      uVar13 = SUB84(SVar4,0);
      uVar14 = (undefined4)((ulong)SVar4 >> 0x20);
    }
    pMVar5 = local_360;
    local_358.m_other = (double)CONCAT44(uVar14,uVar13);
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_350,
                     local_268.m_rhs.
                     super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0>
                     .m_rows.m_value,1,&local_358);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::CwiseBinaryOp(&local_1f0,&local_268,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_350,&local_361);
    local_2a8.m_value =
         (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
    pLVar11 = &local_1f0.m_lhs;
    puVar7 = (undefined8 *)(local_350 + 8);
    for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar7 = (pLVar11->m_lhs).
                super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0>
                .m_data;
      pLVar11 = (LhsNested *)((long)pLVar11 + ((ulong)bVar12 * -2 + 1) * 8);
      puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
    }
    local_350._128_8_ = local_1f0.m_rhs.m_rows.m_value;
    local_2c0.m_other = local_1f0.m_rhs.m_functor.m_other;
    local_2b0.m_value = 1;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
    if ((local_2a8.m_value != 0 && local_1f0.m_rhs.m_rows.m_value != 0) &&
       (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar3 / SEXT816(local_2a8.m_value),0) < local_1f0.m_rhs.m_rows.m_value)) {
      puVar7 = (undefined8 *)
               __cxa_allocate_exception
                         (8,local_1f0.m_rhs.m_rows.m_value,
                          SUB168(auVar3 % SEXT816(local_2a8.m_value),0));
      *puVar7 = &std::out_of_range::vtable;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
               local_1f0.m_rhs.m_rows.m_value,local_2a8.m_value);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Replicate<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,_1,_1>,Eigen::internal::assign_op<double,double>>
              (__return_storage_ptr__,
               (Replicate<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,__1>
                *)local_350,(assign_op<double,_double> *)&local_358);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd SegmentO1::JacobianInverseGramian(
    const Eigen::MatrixXd& local) const {
  if (DimGlobal() == 1) {
    return (coords_.col(1) - coords_.col(0))
        .cwiseInverse()
        .replicate(1, local.cols());
  }
  return ((coords_.col(1) - coords_.col(0)) /
          (coords_.col(1) - coords_.col(0)).squaredNorm())
      .replicate(1, local.cols());
}